

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

list * __thiscall
mjs::parser::parse_variable_declaration_list(list *__return_storage_ptr__,parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  uint64_t uVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  wostream *pwVar7;
  char *__addr_len;
  wchar_t *extraout_RDX;
  wstring_view *s;
  wchar_t *in_R9;
  wstring_view name;
  wstring_view message;
  wstring id;
  wostringstream _oss;
  wstring local_210;
  list *local_1f0;
  wstring local_1e8;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [16];
  undefined1 local_198 [360];
  
  (__return_storage_ptr__->super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_1e8.field_2;
  local_1c8._24_8_ = &this->expression_pos_;
  local_1f0 = __return_storage_ptr__;
  while( true ) {
    if ((this->strict_mode_ == true) && ((this->current_token_).type_ == identifier)) {
      uVar2 = (this->current_token_).field_1.ivalue_;
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_1e8,uVar2,
                 uVar2 + (this->current_token_).field_1.text_._M_string_length * 4);
      _Var3._M_p = local_1e8._M_dataplus._M_p;
      name._M_str = extraout_RDX;
      name._M_len = (size_t)local_1e8._M_dataplus._M_p;
      bVar6 = is_strict_mode_unassignable_identifier((mjs *)local_1e8._M_string_length,name);
      if (bVar6) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
        pwVar7 = std::operator<<((wostream *)local_1a8,"\"");
        local_1c8._0_8_ = local_1e8._M_string_length;
        local_1c8._8_8_ = local_1e8._M_dataplus._M_p;
        cpp_quote_abi_cxx11_(&local_210,(mjs *)local_1c8,s);
        pwVar7 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar7,local_210._M_dataplus._M_p,local_210._M_string_length);
        std::operator<<(pwVar7,"\" may not appear in a variable declaration in strict mode");
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        local_1c8._0_8_ =
             (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_1c8._8_8_ =
             (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_)->_M_use_count + 1
            ;
          }
        }
        local_1c8._16_4_ = this->token_start_;
        local_1c8._20_4_ = *(undefined4 *)&(this->lexer_).text_pos_;
        std::__cxx11::wstringbuf::str();
        message._M_str = in_R9;
        message._M_len = (size_t)local_210._M_dataplus._M_p;
        syntax_error((parser *)"parse_variable_declaration_list",(char *)0x320,(int)local_1c8,
                     (source_extend *)local_210._M_string_length,message);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)_Var3._M_p != paVar1) {
        operator_delete(_Var3._M_p,local_1e8.field_2._M_allocated_capacity * 4 + 4);
      }
    }
    __addr_len = "parse_variable_declaration_list";
    expect((token *)local_1a8,this,identifier,"parse_variable_declaration_list",0x324);
    if ((local_1a8._0_4_ != 2) && (local_1a8._0_4_ != 4)) break;
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)&local_1e8,local_1a8._8_8_,
               (socklen_t *)((long)(parser **)local_1a8._8_8_ + local_198._0_8_ * 4));
    token::destroy((token *)local_1a8);
    local_210._M_dataplus._M_p = (wchar_t *)0x0;
    accept((parser *)local_1a8,(int)this,(sockaddr *)0x1d,(socklen_t *)__addr_len);
    uVar5 = local_1a8._0_4_;
    token::destroy((token *)local_1a8);
    if (uVar5 != 0x72) {
      local_1a8._8_8_ = this->expression_pos_;
      local_198._0_8_ = local_1c8._24_8_;
      this->expression_pos_ = (position_stack_node *)local_1a8;
      local_198._8_4_ = this->token_start_;
      local_1a8._0_8_ = this;
      parse_assignment_expression((parser *)local_1c8);
      uVar4 = local_1c8._0_8_;
      _Var3._M_p = local_210._M_dataplus._M_p;
      local_1c8._0_8_ = (element_type *)0x0;
      local_210._M_dataplus._M_p = (pointer)uVar4;
      if (_Var3._M_p != (wchar_t *)0x0) {
        (**(code **)(*(long *)_Var3._M_p + 8))();
        if ((element_type *)local_1c8._0_8_ != (element_type *)0x0) {
          (**(code **)(*(long *)local_1c8._0_8_ + 8))();
        }
      }
      if (*(parser **)local_198._0_8_ != (parser *)local_1a8) {
        __assert_fail("stack_ == this",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                      ,0x116,"mjs::parser::position_stack_node::~position_stack_node()");
      }
      *(undefined8 *)local_198._0_8_ = local_1a8._8_8_;
      __addr_len = (char *)local_1a8._8_8_;
    }
    declaration::declaration((declaration *)local_1a8,&local_1e8,(expression_ptr *)&local_210);
    std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::emplace_back<mjs::declaration>
              (local_1f0,(declaration *)local_1a8);
    if ((wchar_t *)local_198._16_8_ != (wchar_t *)0x0) {
      (**(code **)(*(long *)local_198._16_8_ + 8))();
    }
    local_198._16_8_ = (wchar_t *)0x0;
    if ((parser *)local_1a8._0_8_ != (parser *)local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._0_8_ * 4 + 4);
    }
    if (local_210._M_dataplus._M_p != (wchar_t *)0x0) {
      (**(code **)(*(long *)local_210._M_dataplus._M_p + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity * 4 + 4);
    }
    accept((parser *)local_1a8,(int)this,(sockaddr *)0x20,(socklen_t *)__addr_len);
    uVar5 = local_1a8._0_4_;
    token::destroy((token *)local_1a8);
    if (uVar5 == 0x72) {
      return local_1f0;
    }
  }
  __assert_fail("has_text()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",0xd6
                ,"const std::wstring &mjs::token::text() const");
}

Assistant:

declaration::list parse_variable_declaration_list() {
        declaration::list l;
        do {
            if (strict_mode_ && current_token_type() == token_type::identifier) {
                if (auto n = current_token().text(); is_strict_mode_unassignable_identifier(n)) {
                    // "args" and "arguments" may not be used as variable names
                    SYNTAX_ERROR("\"" << cpp_quote(n) << "\" may not appear in a variable declaration in strict mode");
                }
            }

            auto id = EXPECT(token_type::identifier).text();

            expression_ptr init{};
            if (accept(token_type::equal)) {
                RECORD_EXPRESSION_START;
                init = parse_assignment_expression();
            }
            l.push_back(declaration{id, std::move(init)});
        } while (accept(token_type::comma));
        return l;
    }